

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O0

complex<long_double> * __thiscall
TPZSBMatrix<std::complex<long_double>_>::GetVal
          (TPZSBMatrix<std::complex<long_double>_> *this,int64_t row,int64_t col)

{
  int64_t iVar1;
  complex<long_double> *pcVar2;
  long in_RCX;
  long in_RDX;
  TPZSBMatrix<std::complex<long_double>_> *in_RSI;
  complex<long_double> *in_RDI;
  int64_t index_1;
  int64_t index;
  complex<long_double> *pcVar3;
  
  if (in_RCX < in_RDX) {
    if (in_RSI->fBand < in_RDX - in_RCX) {
      std::complex<long_double>::complex(in_RDI,(longdouble)0,(longdouble)0);
    }
    else {
      pcVar3 = in_RDI;
      iVar1 = Index(in_RSI,in_RCX,in_RDX);
      TPZVec<std::complex<long_double>_>::operator[](&in_RSI->fDiag,iVar1);
      std::conj<long_double>(pcVar3);
    }
  }
  else if (in_RSI->fBand < in_RCX - in_RDX) {
    std::complex<long_double>::complex(in_RDI,(longdouble)0,(longdouble)0);
  }
  else {
    pcVar3 = in_RDI;
    iVar1 = Index(in_RSI,in_RDX,in_RCX);
    pcVar2 = TPZVec<std::complex<long_double>_>::operator[](&in_RSI->fDiag,iVar1);
    *(undefined8 *)pcVar3->_M_value = *(undefined8 *)pcVar2->_M_value;
    *(undefined8 *)(pcVar3->_M_value + 8) = *(undefined8 *)(pcVar2->_M_value + 8);
    *(undefined8 *)(pcVar3->_M_value + 0x10) = *(undefined8 *)(pcVar2->_M_value + 0x10);
    *(undefined8 *)(pcVar3->_M_value + 0x18) = *(undefined8 *)(pcVar2->_M_value + 0x18);
  }
  return in_RDI;
}

Assistant:

const TVar
TPZSBMatrix<TVar>::GetVal(const int64_t row,const int64_t col ) const
{
    if ( row > col ){
        if (auto index = row-col; index > fBand ){
            return (TVar) 0;//out of band
        }else if constexpr(is_complex<TVar>::value){
            return( std::conj(fDiag[Index(col,row)]) );
        }else{
            return( fDiag[ Index(col,row) ] );
        }
    }
    
    if (auto index = col-row; index > fBand ){
        return (TVar) 0;//out of band
    }else{
        return( fDiag[ Index(row,col) ] );
    }
}